

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> * __thiscall
SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
          (SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *this,
          SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> bits)

{
  longlong lVar1;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *in_RDI;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *this_00;
  
  this_00 = in_RDI;
  lVar1 = ::SafeInt::operator_cast_to_long_long(in_RDI);
  if (lVar1 < 0) {
    __assert_fail("!std::numeric_limits< U >::is_signed || (U)bits >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dcleblanc[P]SafeInt/Test/../SafeInt.hpp"
                  ,0x178b,
                  "SafeInt<T, E> &SafeInt<short>::operator<<=(SafeInt<U, E>) [T = short, E = safeint_exception_handlers::SafeInt_InvalidParameter, U = long long]"
                 );
  }
  lVar1 = ::SafeInt::operator_cast_to_long_long(this_00);
  if (lVar1 < 0x10) {
    lVar1 = ::SafeInt::operator_cast_to_long_long(this_00);
    *(short *)&in_RDI->m_int = (short)((int)(short)in_RDI->m_int << ((byte)lVar1 & 0x1f));
    return (SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)in_RDI;
  }
  __assert_fail("(U)bits < (int)safeint_internal::int_traits< T >::bitCount",
                "/workspace/llm4binary/github/license_c_cmakelists/dcleblanc[P]SafeInt/Test/../SafeInt.hpp"
                ,0x178c,
                "SafeInt<T, E> &SafeInt<short>::operator<<=(SafeInt<U, E>) [T = short, E = safeint_exception_handlers::SafeInt_InvalidParameter, U = long long]"
               );
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E >& operator <<=( SafeInt< U, E > bits ) SAFEINT_NOTHROW
    {
        ShiftAssert( !std::numeric_limits< U >::is_signed || (U)bits >= 0 );
        ShiftAssert( (U)bits < (int)safeint_internal::int_traits< T >::bitCount );

        m_int <<= (U)bits;
        return *this;
    }